

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O3

void __thiscall google::protobuf::DynamicMessage::CrossLinkPrototypes(DynamicMessage *this)

{
  FieldDescriptor *this_00;
  uint uVar1;
  Descriptor *pDVar2;
  long lVar3;
  Type TVar4;
  LogMessage *other;
  TypeInfo *pTVar5;
  uint *puVar6;
  Descriptor *type;
  Message *pMVar7;
  long lVar8;
  long i;
  LogFinisher local_79;
  DynamicMessage *local_78;
  DynamicMessageFactory *local_70;
  LogMessage local_68;
  
  pTVar5 = this->type_info_;
  local_78 = this;
  if (pTVar5->prototype != (DynamicMessage *)0x0 && pTVar5->prototype != this) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/dynamic_message.cc"
               ,0x213);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: is_prototype(): ");
    internal::LogFinisher::operator=(&local_79,other);
    internal::LogMessage::~LogMessage(&local_68);
    pTVar5 = local_78->type_info_;
  }
  pDVar2 = pTVar5->type;
  if (0 < *(int *)(pDVar2 + 0x2c)) {
    local_70 = pTVar5->factory;
    lVar8 = 0;
    i = 0;
    do {
      lVar3 = *(long *)(pDVar2 + 0x30);
      this_00 = (FieldDescriptor *)(lVar3 + lVar8);
      puVar6 = internal::scoped_array<unsigned_int>::operator[](&local_78->type_info_->offsets,i);
      uVar1 = *puVar6;
      TVar4 = FieldDescriptor::type(this_00);
      if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4) == 10) &&
         (*(int *)(lVar3 + 0x4c + lVar8) != 3)) {
        type = FieldDescriptor::message_type(this_00);
        pMVar7 = DynamicMessageFactory::GetPrototypeNoLock(local_70,type);
        *(Message **)
         ((long)&(local_78->super_Message).super_MessageLite._vptr_MessageLite + (long)(int)uVar1) =
             pMVar7;
      }
      i = i + 1;
      lVar8 = lVar8 + 0xa8;
    } while (i < *(int *)(pDVar2 + 0x2c));
  }
  return;
}

Assistant:

inline bool is_prototype() const {
    return type_info_->prototype == this ||
           // If type_info_->prototype is NULL, then we must be constructing
           // the prototype now, which means we must be the prototype.
           type_info_->prototype == NULL;
  }